

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int luaopen_package(lua_State *L)

{
  uint noenv;
  ulong uVar1;
  int n;
  long lVar2;
  
  luaL_newmetatable(L,"_LOADLIB");
  lVar2 = 0;
  lua_pushcclosure(L,lj_cf_package_unloadlib,0);
  uVar1 = (ulong)L->top[-1].u32.lo;
  *(undefined1 *)(uVar1 + 6) = 1;
  *(uint32_t *)(uVar1 + 0x10) = (L->glref).ptr32 + 0xec;
  lua_setfield(L,-2,"__gc");
  luaL_openlib(L,"package",package_lib,0);
  lua_pushvalue(L,-1);
  lua_replace(L,-0x2711);
  lua_createtable(L,4,0);
  n = 1;
  do {
    lua_pushcclosure(L,*(lua_CFunction *)((long)package_loaders + lVar2),0);
    uVar1 = (ulong)L->top[-1].u32.lo;
    *(undefined1 *)(uVar1 + 6) = 1;
    *(uint32_t *)(uVar1 + 0x10) = (L->glref).ptr32 + 0xec;
    lua_rawseti(L,-2,n);
    lVar2 = lVar2 + 8;
    n = n + 1;
  } while (lVar2 != 0x20);
  lua_setfield(L,-2,"loaders");
  lua_getfield(L,-10000,"LUA_NOENV");
  noenv = (uint)(*(uint *)((long)L->top + -4) < 0xfffffffe);
  L->top = L->top + -1;
  setpath(L,"path","LUA_PATH",
          "./?.lua;/usr/local/share/luajit-2.0.4/?.lua;/usr/local/share/lua/5.1/?.lua;/usr/local/share/lua/5.1/?/init.lua"
          ,noenv);
  setpath(L,"cpath","LUA_CPATH",
          "./?.so;/usr/local/lib/lua/5.1/?.so;/usr/local/lib/lua/5.1/loadall.so",noenv);
  lua_pushlstring(L,"/\n;\n?\n!\n-",9);
  lua_setfield(L,-2,"config");
  luaL_findtable(L,-10000,"_LOADED",0x10);
  lua_setfield(L,-2,"loaded");
  luaL_findtable(L,-10000,"_PRELOAD",4);
  lua_setfield(L,-2,"preload");
  lua_pushvalue(L,-0x2712);
  luaL_openlib(L,(char *)0x0,package_global,0);
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUALIB_API int luaopen_package(lua_State *L)
{
  int i;
  int noenv;
  luaL_newmetatable(L, "_LOADLIB");
  lj_lib_pushcf(L, lj_cf_package_unloadlib, 1);
  lua_setfield(L, -2, "__gc");
  luaL_register(L, LUA_LOADLIBNAME, package_lib);
  lua_pushvalue(L, -1);
  lua_replace(L, LUA_ENVIRONINDEX);
  lua_createtable(L, sizeof(package_loaders)/sizeof(package_loaders[0])-1, 0);
  for (i = 0; package_loaders[i] != NULL; i++) {
    lj_lib_pushcf(L, package_loaders[i], 1);
    lua_rawseti(L, -2, i+1);
  }
  lua_setfield(L, -2, "loaders");
  lua_getfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  noenv = lua_toboolean(L, -1);
  lua_pop(L, 1);
  setpath(L, "path", LUA_PATH, LUA_PATH_DEFAULT, noenv);
  setpath(L, "cpath", LUA_CPATH, LUA_CPATH_DEFAULT, noenv);
  lua_pushliteral(L, LUA_PATH_CONFIG);
  lua_setfield(L, -2, "config");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
  lua_setfield(L, -2, "loaded");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD", 4);
  lua_setfield(L, -2, "preload");
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  luaL_register(L, NULL, package_global);
  lua_pop(L, 1);
  return 1;
}